

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

NaReal __thiscall NaVector::metric(NaVector *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  dVar4 = 0.0;
  if (iVar1 != 0) {
    uVar3 = 0;
    do {
      dVar4 = dVar4 + this->pVect[uVar3] * this->pVect[uVar3];
      uVar3 = uVar3 + 1;
      uVar2 = (*this->_vptr_NaVector[6])(this);
    } while (uVar3 < uVar2);
  }
  if (0.0 <= dVar4) {
    return SQRT(dVar4);
  }
  dVar4 = sqrt(dVar4);
  return dVar4;
}

Assistant:

NaReal
NaVector::metric () const
{
    unsigned    i;
    NaReal      vMetric = 0.0;
    for(i = 0; i < dim(); ++i)
        vMetric += pVect[i] * pVect[i];
    return sqrt(vMetric);
}